

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string * __thiscall
cs_impl::any::
holder<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
::to_string_abi_cxx11_
          (holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
           *this)

{
  string *in_RDI;
  hash_set *in_stack_000000e8;
  
  to_string<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
            (in_stack_000000e8);
  return in_RDI;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}